

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall spv::Builder::makeDebugDeclare(Builder *this,Id debugLocalVariable,Id pointer)

{
  Id IVar1;
  Id typeId;
  Instruction *pIVar2;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_28;
  Instruction *local_20;
  Instruction *inst;
  Id pointer_local;
  Id debugLocalVariable_local;
  Builder *this_local;
  
  inst._0_4_ = pointer;
  inst._4_4_ = debugLocalVariable;
  _pointer_local = this;
  pIVar2 = (Instruction *)::operator_new(0x60);
  IVar1 = getUniqueId(this);
  typeId = makeVoidType(this);
  spv::Instruction::Instruction(pIVar2,IVar1,typeId,OpExtInst);
  local_20 = pIVar2;
  spv::Instruction::reserveOperands(pIVar2,5);
  spv::Instruction::addIdOperand(local_20,this->nonSemanticShaderDebugInfo);
  spv::Instruction::addImmediateOperand(local_20,0x1c);
  spv::Instruction::addIdOperand(local_20,inst._4_4_);
  spv::Instruction::addIdOperand(local_20,(Id)inst);
  pIVar2 = local_20;
  IVar1 = makeDebugExpression(this);
  spv::Instruction::addIdOperand(pIVar2,IVar1);
  std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
  unique_ptr<std::default_delete<spv::Instruction>,void>
            ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_28,
             local_20);
  addInstruction(this,&local_28);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&local_28);
  IVar1 = spv::Instruction::getResultId(local_20);
  return IVar1;
}

Assistant:

Id Builder::makeDebugDeclare(Id const debugLocalVariable, Id const pointer)
{
    Instruction* inst = new Instruction(getUniqueId(), makeVoidType(), OpExtInst);
    inst->reserveOperands(5);
    inst->addIdOperand(nonSemanticShaderDebugInfo);
    inst->addImmediateOperand(NonSemanticShaderDebugInfo100DebugDeclare);
    inst->addIdOperand(debugLocalVariable); // debug local variable id
    inst->addIdOperand(pointer); // pointer to local variable id
    inst->addIdOperand(makeDebugExpression()); // expression id
    addInstruction(std::unique_ptr<Instruction>(inst));

    return inst->getResultId();
}